

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t __thiscall
httplib::ClientImpl::send(ClientImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Headers *this_00;
  mutex *__mutex;
  size_t *psVar1;
  Headers *pHVar2;
  pthread_mutex_t *__mutex_00;
  Error *pEVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  pthread_t pVar7;
  iterator iVar8;
  _Base_ptr p_Var9;
  Socket *socket;
  undefined4 in_register_00000034;
  SSLClient *scli;
  pthread_mutex_t *__mutex_01;
  lock_guard<std::mutex> guard;
  bool close_connection;
  pthread_mutex_t *local_a8;
  Socket *local_a0;
  Response *local_98;
  Request *local_90;
  pthread_mutex_t *local_88;
  Error *local_80;
  _Function_base local_78;
  bool success;
  Request *local_50;
  Response *local_48;
  bool *local_40;
  Error *local_38;
  
  local_90 = (Request *)CONCAT44(in_register_00000034,__fd);
  __mutex_01 = (pthread_mutex_t *)&this->request_mutex_;
  local_98 = (Response *)__buf;
  std::recursive_mutex::lock((recursive_mutex *)&__mutex_01->__data);
  __mutex = &this->socket_mutex_;
  std::mutex::lock(__mutex);
  this->socket_should_be_closed_when_request_is_done_ = false;
  socket = &this->socket_;
  iVar5 = (this->socket_).sock;
  local_a0 = socket;
  if (iVar5 == -1) {
LAB_00115178:
    iVar5 = (*this->_vptr_ClientImpl[3])(this,socket,__n);
    if ((char)iVar5 == '\0') {
LAB_001151ff:
      bVar4 = false;
      socket = (Socket *)0x0;
      goto LAB_00115203;
    }
    iVar5 = (*this->_vptr_ClientImpl[6])(this);
    if ((char)iVar5 != '\0') {
      if (((this->proxy_host_)._M_string_length != 0) && (this->proxy_port_ != -1)) {
        _success = (ClientImpl *)((ulong)_success & 0xffffffffffffff00);
        bVar4 = SSLClient::connect_with_proxy
                          ((SSLClient *)this,socket,local_98,&success,(Error *)__n);
        if (!bVar4) {
          socket = (Socket *)CONCAT71((int7)((ulong)socket >> 8),success);
          bVar4 = false;
          goto LAB_00115203;
        }
      }
      bVar4 = SSLClient::initialize_ssl((SSLClient *)this,socket,(Error *)__n);
      if (!bVar4) goto LAB_001151ff;
    }
  }
  else {
    bVar4 = detail::is_socket_alive(iVar5);
    if (!bVar4) {
      (*this->_vptr_ClientImpl[4])(this,socket,0);
      shutdown_socket(this,socket);
      close_socket(this,socket);
      goto LAB_00115178;
    }
  }
  this->socket_requests_in_flight_ = this->socket_requests_in_flight_ + 1;
  pVar7 = pthread_self();
  (this->socket_requests_are_from_thread_)._M_thread = pVar7;
  bVar4 = true;
LAB_00115203:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (bVar4) {
    this_00 = &local_90->headers;
    pHVar2 = &local_90->headers;
    local_a8 = __mutex_01;
    local_88 = (pthread_mutex_t *)__mutex;
    local_80 = (Error *)__n;
    for (p_Var9 = (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pEVar3 = local_80,
        (_Rb_tree_header *)p_Var9 != &(this->default_headers_)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this_00->_M_t,(key_type *)(p_Var9 + 1));
      if ((_Rb_tree_header *)iVar8._M_node == &(pHVar2->_M_t)._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_insert_equal<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this_00,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(p_Var9 + 1));
      }
    }
    close_connection = (bool)(this->keep_alive_ ^ 1);
    local_40 = &close_connection;
    local_50 = local_90;
    local_48 = local_98;
    local_38 = local_80;
    _success = this;
    std::function<bool(httplib::Stream&)>::
    function<httplib::ClientImpl::send(httplib::Request&,httplib::Response&,httplib::Error&)::_lambda(httplib::Stream&)_1_,void>
              ((function<bool(httplib::Stream&)> *)&local_78,(anon_class_40_5_61c9469f *)&success);
    __mutex_01 = local_a8;
    uVar6 = (*this->_vptr_ClientImpl[5])(this,local_a0,&local_78);
    __mutex_00 = local_88;
    socket = (Socket *)(ulong)uVar6;
    std::_Function_base::~_Function_base(&local_78);
    std::mutex::lock((mutex *)&__mutex_00->__data);
    psVar1 = &this->socket_requests_in_flight_;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (this->socket_requests_are_from_thread_)._M_thread = 0;
    }
    if (((this->socket_should_be_closed_when_request_is_done_ != false) || ((char)uVar6 == '\0')) ||
       (close_connection != false)) {
      (*this->_vptr_ClientImpl[4])(this,local_a0,1);
      shutdown_socket(this,local_a0);
      close_socket(this,local_a0);
    }
    pthread_mutex_unlock(__mutex_00);
    if (*pEVar3 == Success && (char)uVar6 == '\0') {
      *pEVar3 = Unknown;
    }
  }
  pthread_mutex_unlock(__mutex_01);
  return (ulong)socket & 0xffffff01;
}

Assistant:

inline bool ClientImpl::send(Request& req, Response& res, Error& error) {
        std::lock_guard<std::recursive_mutex> request_mutex_guard(request_mutex_);

        {
            std::lock_guard<std::mutex> guard(socket_mutex_);

            // Set this to false immediately - if it ever gets set to true by the end of
            // the request, we know another thread instructed us to close the socket.
            socket_should_be_closed_when_request_is_done_ = false;

            auto is_alive = false;
            if (socket_.is_open()) {
                is_alive = detail::is_socket_alive(socket_.sock);
                if (!is_alive) {
                    // Attempt to avoid sigpipe by shutting down nongracefully if it seems
                    // like the other side has already closed the connection Also, there
                    // cannot be any requests in flight from other threads since we locked
                    // request_mutex_, so safe to close everything immediately
                    const bool shutdown_gracefully = false;
                    shutdown_ssl(socket_, shutdown_gracefully);
                    shutdown_socket(socket_);
                    close_socket(socket_);
                }
            }

            if (!is_alive) {
                if (!create_and_connect_socket(socket_, error)) { return false; }

            #ifdef CPPHTTPLIB_OPENSSL_SUPPORT
                // TODO: refactoring
                if (is_ssl()) {
                    auto& scli = static_cast<SSLClient&>(*this);
                    if (!proxy_host_.empty() && proxy_port_ != -1) {
                        bool success = false;
                        if (!scli.connect_with_proxy(socket_, res, success, error)) {
                            return success;
                        }
                    }

                    if (!scli.initialize_ssl(socket_, error)) { return false; }
                }
            #endif
            }

            // Mark the current socket as being in use so that it cannot be closed by
            // anyone else while this request is ongoing, even though we will be
            // releasing the mutex.
            if (socket_requests_in_flight_ > 1) {
                assert(socket_requests_are_from_thread_ == std::this_thread::get_id());
            }
            socket_requests_in_flight_ += 1;
            socket_requests_are_from_thread_ = std::this_thread::get_id();
        }

        for (const auto& header : default_headers_) {
            if (req.headers.find(header.first) == req.headers.end()) {
                req.headers.insert(header);
            }
        }

        auto close_connection = !keep_alive_;
        auto ret = process_socket(socket_, [&](Stream& strm) {
            return handle_request(strm, req, res, close_connection, error);
        });

        // Briefly lock mutex in order to mark that a request is no longer ongoing
        {
            std::lock_guard<std::mutex> guard(socket_mutex_);
            socket_requests_in_flight_ -= 1;
            if (socket_requests_in_flight_ <= 0) {
                assert(socket_requests_in_flight_ == 0);
                socket_requests_are_from_thread_ = std::thread::id();
            }

            if (socket_should_be_closed_when_request_is_done_ || close_connection ||
                !ret) {
                shutdown_ssl(socket_, true);
                shutdown_socket(socket_);
                close_socket(socket_);
            }
        }

        if (!ret) {
            if (error == Error::Success) { error = Error::Unknown; }
        }

        return ret;
    }